

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRationalBezierCurve::IfcRationalBezierCurve
          (IfcRationalBezierCurve *this)

{
  IfcRationalBezierCurve *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xe8,"IfcRationalBezierCurve");
  IfcBezierCurve::IfcBezierCurve((IfcBezierCurve *)this,&PTR_construction_vtable_24__010063a0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>,
             &PTR_construction_vtable_24__010064d8);
  *(undefined8 *)this = 0x1006270;
  *(undefined8 *)&this->field_0xe8 = 0x1006388;
  *(undefined8 *)&this->field_0x10 = 0x1006298;
  *(undefined8 *)&this->field_0x20 = 0x10062c0;
  *(undefined8 *)&this->field_0x30 = 0x10062e8;
  *(undefined8 *)&this->field_0x40 = 0x1006310;
  *(undefined8 *)&this->field_0xb0 = 0x1006338;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
  _vptr_ObjectHelper = (_func_int **)0x1006360;
  STEP::ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::EXPRESS::PrimitiveDataType<double>,_2UL,_0UL> *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRationalBezierCurve,_1UL>).
              field_0x10);
  return;
}

Assistant:

IfcRationalBezierCurve() : Object("IfcRationalBezierCurve") {}